

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,Node *parent,Reader *declaration)

{
  uint uVar1;
  Node *this_00;
  Impl *pIVar2;
  void *pvVar3;
  CapTableReader *pCVar4;
  WirePointer *pWVar5;
  StructDataBitCount SVar6;
  StructPointerCount SVar7;
  undefined2 uVar8;
  int iVar9;
  undefined4 uVar10;
  Which WVar11;
  uint32_t uVar12;
  uint64_t uVar13;
  size_t in_RCX;
  size_t in_R8;
  Reader RVar14;
  ArrayPtr<const_char> AVar15;
  StringPtr declName;
  StringPtr declName_00;
  Reader name;
  Reader local_60;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_00274120;
  this->module = parent->module;
  (this->parent).ptr = parent;
  pCVar4 = (declaration->_reader).capTable;
  pvVar3 = (declaration->_reader).data;
  pWVar5 = (declaration->_reader).pointers;
  SVar6 = (declaration->_reader).dataSize;
  SVar7 = (declaration->_reader).pointerCount;
  uVar8 = *(undefined2 *)&(declaration->_reader).field_0x26;
  iVar9 = (declaration->_reader).nestingLimit;
  uVar10 = *(undefined4 *)&(declaration->_reader).field_0x2c;
  (this->declaration)._reader.segment = (declaration->_reader).segment;
  (this->declaration)._reader.capTable = pCVar4;
  (this->declaration)._reader.data = pvVar3;
  (this->declaration)._reader.pointers = pWVar5;
  (this->declaration)._reader.dataSize = SVar6;
  (this->declaration)._reader.pointerCount = SVar7;
  *(undefined2 *)&(this->declaration)._reader.field_0x26 = uVar8;
  (this->declaration)._reader.nestingLimit = iVar9;
  *(undefined4 *)&(this->declaration)._reader.field_0x2c = uVar10;
  this_00 = (Node *)parent->id;
  Declaration::Reader::getName(&local_60,declaration);
  RVar14 = LocatedText::Reader::getValue(&local_60);
  declName.content.ptr = RVar14.super_StringPtr.content.size_;
  declName.content.size_ = in_RCX;
  uVar13 = generateId(this_00,(uint64_t)RVar14.super_StringPtr.content.ptr,declName,
                      (Reader)declaration->_reader);
  this->id = uVar13;
  pIVar2 = parent->module->compiler;
  Declaration::Reader::getName(&local_60,declaration);
  RVar14 = LocatedText::Reader::getValue(&local_60);
  declName_00.content.size_ = in_R8;
  declName_00.content.ptr = RVar14.super_StringPtr.content.size_;
  AVar15 = (ArrayPtr<const_char>)
           joinDisplayName((Node *)&pIVar2->nodeArena,(Arena *)parent,
                           RVar14.super_StringPtr.content.ptr,declName_00);
  (this->displayName).content = AVar15;
  if ((declaration->_reader).dataSize < 0x20) {
    WVar11 = FILE;
  }
  else {
    WVar11 = *(Which *)((long)(declaration->_reader).data + 2);
  }
  this->kind = WVar11;
  Declaration::Reader::getParameters((Reader *)&local_60,declaration);
  this->genericParamCount = (uint)local_60._reader.pointers;
  this->isBuiltin = false;
  Content::Content(&this->guardedContent);
  this->inGetContent = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  Declaration::Reader::getName(&local_60,declaration);
  RVar14 = LocatedText::Reader::getValue(&local_60);
  if (RVar14.super_StringPtr.content.size_ == 1) {
    uVar1 = (declaration->_reader).dataSize;
    if (uVar1 < 0x40) {
LAB_00143e34:
      this->startByte = 0;
    }
    else {
      pvVar3 = (declaration->_reader).data;
      this->startByte = *(uint32_t *)((long)pvVar3 + 4);
      if (0x5f < uVar1) {
        uVar12 = *(uint32_t *)((long)pvVar3 + 8);
        goto LAB_00143e3a;
      }
    }
  }
  else {
    if (local_60._reader.dataSize < 0x20) goto LAB_00143e34;
    this->startByte = *local_60._reader.data;
    if (0x3f < local_60._reader.dataSize) {
      uVar12 = *(uint32_t *)((long)local_60._reader.data + 4);
      goto LAB_00143e3a;
    }
  }
  uVar12 = 0;
LAB_00143e3a:
  this->endByte = uVar12;
  uVar13 = Impl::addNode(this->module->compiler,this->id,this);
  this->id = uVar13;
  return;
}

Assistant:

Compiler::Node::Node(Node& parent, const Declaration::Reader& declaration)
    : module(parent.module),
      parent(parent),
      declaration(declaration),
      id(generateId(parent.id, declaration.getName().getValue(), declaration.getId())),
      displayName(joinDisplayName(parent.module->getCompiler().getNodeArena(),
                                  parent, declaration.getName().getValue())),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module->getCompiler().addNode(id, *this);
}